

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt)

{
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  int expandParam;
  int inParam;
  int res;
  xmlParserCtxtPtr ctxt_local;
  
  expandParam = 0;
  local_25 = false;
  if (ctxt->input->entity != (xmlEntityPtr)0x0) {
    local_26 = true;
    if (ctxt->input->entity->etype != XML_INTERNAL_PARAMETER_ENTITY) {
      local_26 = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
    }
    local_25 = local_26;
  }
  local_27 = true;
  if (ctxt->inSubset != 2) {
    local_28 = false;
    if (ctxt->input->entity != (xmlEntityPtr)0x0) {
      local_28 = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
    }
    local_27 = local_28;
  }
  if ((local_25) || (local_27)) {
    while (ctxt->disableSAX < 2) {
      if ((*ctxt->input->cur == ' ') ||
         (((8 < *ctxt->input->cur && (*ctxt->input->cur < 0xb)) || (*ctxt->input->cur == '\r')))) {
        xmlNextChar(ctxt);
      }
      else if (*ctxt->input->cur == '%') {
        if ((((!local_27) || (ctxt->input->cur[1] == ' ')) ||
            ((8 < ctxt->input->cur[1] && (ctxt->input->cur[1] < 0xb)))) ||
           ((ctxt->input->cur[1] == '\r' || (ctxt->input->cur[1] == '\0')))) break;
        xmlParsePEReference(ctxt);
        local_29 = false;
        if (ctxt->input->entity != (xmlEntityPtr)0x0) {
          local_2a = true;
          if (ctxt->input->entity->etype != XML_INTERNAL_PARAMETER_ENTITY) {
            local_2a = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
          }
          local_29 = local_2a;
        }
        local_2b = true;
        local_25 = local_29;
        local_27 = local_2b;
        if ((ctxt->inSubset != 2) &&
           (local_2c = false, local_27 = local_2c, ctxt->input->entity != (xmlEntityPtr)0x0)) {
          local_27 = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
        }
      }
      else {
        if ((*ctxt->input->cur != '\0') || (!local_25)) break;
        xmlPopPE(ctxt);
        local_2d = false;
        if (ctxt->input->entity != (xmlEntityPtr)0x0) {
          local_2e = true;
          if (ctxt->input->entity->etype != XML_INTERNAL_PARAMETER_ENTITY) {
            local_2e = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
          }
          local_2d = local_2e;
        }
        local_2f = true;
        local_25 = local_2d;
        local_27 = local_2f;
        if ((ctxt->inSubset != 2) &&
           (local_30 = false, local_27 = local_30, ctxt->input->entity != (xmlEntityPtr)0x0)) {
          local_27 = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
        }
      }
      if (expandParam < 0x7fffffff) {
        expandParam = expandParam + 1;
      }
    }
    ctxt_local._4_4_ = expandParam;
  }
  else {
    ctxt_local._4_4_ = xmlSkipBlankChars(ctxt);
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSkipBlankCharsPE(xmlParserCtxtPtr ctxt) {
    int res = 0;
    int inParam;
    int expandParam;

    inParam = PARSER_IN_PE(ctxt);
    expandParam = PARSER_EXTERNAL(ctxt);

    if (!inParam && !expandParam)
        return(xmlSkipBlankChars(ctxt));

    /*
     * It's Okay to use CUR/NEXT here since all the blanks are on
     * the ASCII range.
     */
    while (PARSER_STOPPED(ctxt) == 0) {
        if (IS_BLANK_CH(CUR)) { /* CHECKED tstblanks.xml */
            NEXT;
        } else if (CUR == '%') {
            if ((expandParam == 0) ||
                (IS_BLANK_CH(NXT(1))) || (NXT(1) == 0))
                break;

            /*
             * Expand parameter entity. We continue to consume
             * whitespace at the start of the entity and possible
             * even consume the whole entity and pop it. We might
             * even pop multiple PEs in this loop.
             */
            xmlParsePEReference(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else if (CUR == 0) {
            if (inParam == 0)
                break;

            xmlPopPE(ctxt);

            inParam = PARSER_IN_PE(ctxt);
            expandParam = PARSER_EXTERNAL(ctxt);
        } else {
            break;
        }

        /*
         * Also increase the counter when entering or exiting a PERef.
         * The spec says: "When a parameter-entity reference is recognized
         * in the DTD and included, its replacement text MUST be enlarged
         * by the attachment of one leading and one following space (#x20)
         * character."
         */
        if (res < INT_MAX)
            res++;
    }

    return(res);
}